

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O2

void __thiscall FIWadManager::ParseIWadInfo(FIWadManager *this,char *fn,char *data,int datasize)

{
  FString *this_00;
  TArray<FString,_FString> *this_01;
  bool bVar1;
  uint uVar2;
  DWORD DVar3;
  int iVar4;
  char *pcVar5;
  FIWADInfo *this_02;
  FIWADInfo *pFVar6;
  FString wadname;
  FScanner sc;
  
  FScanner::FScanner(&sc);
  FScanner::OpenMem(&sc,"IWADINFO",data,datasize);
  this_01 = &this->mIWadNames;
  do {
    while( true ) {
      bVar1 = FScanner::GetString(&sc);
      if (!bVar1) {
        FScanner::~FScanner(&sc);
        return;
      }
      bVar1 = FScanner::Compare(&sc,"IWAD");
      if (bVar1) break;
      bVar1 = FScanner::Compare(&sc,"NAMES");
      if (bVar1) {
        FScanner::MustGetStringName(&sc,"{");
        wadname.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        TArray<FString,_FString>::Push(this_01,&wadname);
        while( true ) {
          FString::~FString(&wadname);
          bVar1 = FScanner::CheckString(&sc,"}");
          if (bVar1) break;
          FScanner::MustGetString(&sc);
          FString::FString(&wadname,sc.String);
          FString::ToLower(&wadname);
          TArray<FString,_FString>::Push(this_01,&wadname);
          iVar4 = toupper((int)*wadname.Chars);
          pcVar5 = FString::LockBuffer(&wadname);
          *pcVar5 = (char)iVar4;
          FString::UnlockBuffer(&wadname);
          TArray<FString,_FString>::Push(this_01,&wadname);
          FString::ToUpper(&wadname);
          TArray<FString,_FString>::Push(this_01,&wadname);
        }
      }
    }
    uVar2 = TArray<FIWADInfo,_FIWADInfo>::Reserve(&this->mIWads,1);
    pFVar6 = (this->mIWads).Array + uVar2;
    FScanner::MustGetStringName(&sc,"{");
    this_00 = &pFVar6->MapInfo;
    while (bVar1 = FScanner::CheckString(&sc,"}"), !bVar1) {
      FScanner::MustGetString(&sc);
      bVar1 = FScanner::Compare(&sc,"Name");
      if (bVar1) {
        FScanner::MustGetStringName(&sc,"=");
        FScanner::MustGetString(&sc);
        this_02 = pFVar6;
LAB_00435f41:
        FString::operator=(&this_02->Name,sc.String);
      }
      else {
        bVar1 = FScanner::Compare(&sc,"Autoname");
        if (bVar1) {
          FScanner::MustGetStringName(&sc,"=");
          FScanner::MustGetString(&sc);
          this_02 = (FIWADInfo *)&pFVar6->Autoname;
          goto LAB_00435f41;
        }
        bVar1 = FScanner::Compare(&sc,"Config");
        if (bVar1) {
          FScanner::MustGetStringName(&sc,"=");
          FScanner::MustGetString(&sc);
          this_02 = (FIWADInfo *)&pFVar6->Configname;
          goto LAB_00435f41;
        }
        bVar1 = FScanner::Compare(&sc,"Game");
        if (bVar1) {
          FScanner::MustGetStringName(&sc,"=");
          FScanner::MustGetString(&sc);
          bVar1 = FScanner::Compare(&sc,"Doom");
          if (bVar1) {
            pFVar6->gametype = GAME_Doom;
          }
          else {
            bVar1 = FScanner::Compare(&sc,"Heretic");
            if (bVar1) {
              pFVar6->gametype = GAME_Heretic;
            }
            else {
              bVar1 = FScanner::Compare(&sc,"Hexen");
              if (bVar1) {
                pFVar6->gametype = GAME_Hexen;
              }
              else {
                bVar1 = FScanner::Compare(&sc,"Strife");
                if (bVar1) {
                  pFVar6->gametype = GAME_Strife;
                }
                else {
                  bVar1 = FScanner::Compare(&sc,"Chex");
                  if (bVar1) {
                    pFVar6->gametype = GAME_Chex;
                  }
                  else {
                    FScanner::ScriptError(&sc,(char *)0x0);
                  }
                }
              }
            }
          }
        }
        else {
          bVar1 = FScanner::Compare(&sc,"Mapinfo");
          if (bVar1) {
            FScanner::MustGetStringName(&sc,"=");
            FScanner::MustGetString(&sc);
            this_02 = (FIWADInfo *)this_00;
            goto LAB_00435f41;
          }
          bVar1 = FScanner::Compare(&sc,"Compatibility");
          if (bVar1) {
            FScanner::MustGetStringName(&sc,"=");
            do {
              FScanner::MustGetString(&sc);
              bVar1 = FScanner::Compare(&sc,"NoTextcolor");
              uVar2 = 0x100;
              if (bVar1) {
LAB_004360b0:
                pFVar6->flags = pFVar6->flags | uVar2;
              }
              else {
                bVar1 = FScanner::Compare(&sc,"Poly1");
                uVar2 = 0x40;
                if (bVar1) goto LAB_004360b0;
                bVar1 = FScanner::Compare(&sc,"Poly2");
                uVar2 = 0x80;
                if (bVar1) goto LAB_004360b0;
                bVar1 = FScanner::Compare(&sc,"Shareware");
                uVar2 = 2;
                if (bVar1) goto LAB_004360b0;
                bVar1 = FScanner::Compare(&sc,"Teaser2");
                uVar2 = 8;
                if (bVar1) goto LAB_004360b0;
                bVar1 = FScanner::Compare(&sc,"Extended");
                uVar2 = 4;
                if (bVar1) goto LAB_004360b0;
                bVar1 = FScanner::Compare(&sc,"Shorttex");
                uVar2 = 0x10;
                if (bVar1) goto LAB_004360b0;
                bVar1 = FScanner::Compare(&sc,"Stairs");
                uVar2 = 0x20;
                if (bVar1) goto LAB_004360b0;
                FScanner::ScriptError(&sc,(char *)0x0);
              }
              bVar1 = FScanner::CheckString(&sc,",");
            } while (bVar1);
          }
          else {
            bVar1 = FScanner::Compare(&sc,"MustContain");
            if (bVar1) {
              FScanner::MustGetStringName(&sc,"=");
              do {
                FScanner::MustGetString(&sc);
                FString::FString(&wadname,sc.String);
                TArray<FString,_FString>::Push(&pFVar6->Lumps,&wadname);
                FString::~FString(&wadname);
                bVar1 = FScanner::CheckString(&sc,",");
              } while (bVar1);
            }
            else {
              bVar1 = FScanner::Compare(&sc,"BannerColors");
              if (bVar1) {
                FScanner::MustGetStringName(&sc,"=");
                FScanner::MustGetString(&sc);
                DVar3 = V_GetColor((DWORD *)0x0,sc.String);
                pFVar6->FgColor = DVar3;
                FScanner::MustGetStringName(&sc,",");
                FScanner::MustGetString(&sc);
                DVar3 = V_GetColor((DWORD *)0x0,sc.String);
                pFVar6->BkColor = DVar3;
              }
              else {
                bVar1 = FScanner::Compare(&sc,"Load");
                if (bVar1) {
                  FScanner::MustGetStringName(&sc,"=");
                  do {
                    FScanner::MustGetString(&sc);
                    FString::FString(&wadname,sc.String);
                    TArray<FString,_FString>::Push(&pFVar6->Load,&wadname);
                    FString::~FString(&wadname);
                    bVar1 = FScanner::CheckString(&sc,",");
                  } while (bVar1);
                }
                else {
                  bVar1 = FScanner::Compare(&sc,"Required");
                  if (bVar1) {
                    FScanner::MustGetStringName(&sc,"=");
                    FScanner::MustGetString(&sc);
                    this_02 = (FIWADInfo *)&pFVar6->Required;
                    goto LAB_00435f41;
                  }
                  FScanner::ScriptError(&sc,"Unknown keyword \'%s\'",sc.String);
                }
              }
            }
          }
        }
      }
    }
    if (*(int *)(this_00->Chars + -0xc) == 0) {
      FString::operator=(this_00,"mapinfo/mindefaults.txt");
    }
  } while( true );
}

Assistant:

void FIWadManager::ParseIWadInfo(const char *fn, const char *data, int datasize)
{
	FScanner sc;

	sc.OpenMem("IWADINFO", data, datasize);
	while (sc.GetString())
	{
		if (sc.Compare("IWAD"))
		{
			FIWADInfo *iwad = &mIWads[mIWads.Reserve(1)];
			sc.MustGetStringName("{");
			while (!sc.CheckString("}"))
			{
				sc.MustGetString();
				if (sc.Compare("Name"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Name = sc.String;
				}
				else if (sc.Compare("Autoname"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Autoname = sc.String;
				}
				else if (sc.Compare("Config"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Configname = sc.String;
				}
				else if (sc.Compare("Game"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					if (sc.Compare("Doom")) iwad->gametype = GAME_Doom;
					else if (sc.Compare("Heretic")) iwad->gametype = GAME_Heretic;
					else if (sc.Compare("Hexen")) iwad->gametype = GAME_Hexen;
					else if (sc.Compare("Strife")) iwad->gametype = GAME_Strife;
					else if (sc.Compare("Chex")) iwad->gametype = GAME_Chex;
					else sc.ScriptError(NULL);
				}
				else if (sc.Compare("Mapinfo"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->MapInfo = sc.String;
				}
				else if (sc.Compare("Compatibility"))
				{
					sc.MustGetStringName("=");
					do
					{
						sc.MustGetString();
						if(sc.Compare("NoTextcolor")) iwad->flags |= GI_NOTEXTCOLOR;
						else if(sc.Compare("Poly1")) iwad->flags |= GI_COMPATPOLY1;
						else if(sc.Compare("Poly2")) iwad->flags |= GI_COMPATPOLY2;
						else if(sc.Compare("Shareware")) iwad->flags |= GI_SHAREWARE;
						else if(sc.Compare("Teaser2")) iwad->flags |= GI_TEASER2;
						else if(sc.Compare("Extended")) iwad->flags |= GI_MENUHACK_EXTENDED;
						else if(sc.Compare("Shorttex")) iwad->flags |= GI_COMPATSHORTTEX;
						else if(sc.Compare("Stairs")) iwad->flags |= GI_COMPATSTAIRS;
						else sc.ScriptError(NULL);
					}
					while (sc.CheckString(","));
				}
				else if (sc.Compare("MustContain"))
				{
					sc.MustGetStringName("=");
					do
					{
						sc.MustGetString();
						iwad->Lumps.Push(FString(sc.String));
					}
					while (sc.CheckString(","));
				}
				else if (sc.Compare("BannerColors"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->FgColor = V_GetColor(NULL, sc.String);
					sc.MustGetStringName(",");
					sc.MustGetString();
					iwad->BkColor = V_GetColor(NULL, sc.String);
				}
				else if (sc.Compare("Load"))
				{
					sc.MustGetStringName("=");
					do
					{
						sc.MustGetString();
						iwad->Load.Push(FString(sc.String));
					}
					while (sc.CheckString(","));
				}
				else if (sc.Compare("Required"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Required = sc.String;
				}
				else
				{
					sc.ScriptError("Unknown keyword '%s'", sc.String);
				}
			}
			if (iwad->MapInfo.IsEmpty())
			{
				// We must at least load the minimum defaults to allow the engine to run.
				iwad->MapInfo = "mapinfo/mindefaults.txt";
			}
		}
		else if (sc.Compare("NAMES"))
		{
			sc.MustGetStringName("{");
			mIWadNames.Push(FString());
			while (!sc.CheckString("}"))
			{
				sc.MustGetString();
				FString wadname = sc.String;
#if defined(_WIN32) || defined(__APPLE__) // Turns out Mac OS X is case insensitive.
				mIWadNames.Push(wadname);
#else
				// check for lowercase, uppercased first letter and full uppercase on Linux etc.
				wadname.ToLower();
				mIWadNames.Push(wadname);
				wadname.LockBuffer()[0] = toupper(wadname[0]);
				wadname.UnlockBuffer();
				mIWadNames.Push(wadname);
				wadname.ToUpper();
				mIWadNames.Push(wadname);
#endif
			}
		}
	}
}